

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

pair<const_char_*,_unsigned_long>
google::protobuf::internal::VarintParseSlow64(char *p,uint32_t res32)

{
  byte bVar1;
  long lVar2;
  pair<const_char_*,_unsigned_long> pVar3;
  
  pVar3.second = (ulong)res32;
  pVar3.first = (byte *)(p + 2);
  lVar2 = 0xe;
  do {
    if (lVar2 == 0x46) {
      return (pair<const_char_*,_unsigned_long>)ZEXT816(0);
    }
    bVar1 = *pVar3.first;
    pVar3.second = pVar3.second + ((ulong)bVar1 - 1 << ((byte)lVar2 & 0x3f));
    pVar3.first = pVar3.first + 1;
    lVar2 = lVar2 + 7;
  } while ((char)bVar1 < '\0');
  return pVar3;
}

Assistant:

std::pair<const char*, uint64_t> VarintParseSlow64(const char* p,
                                                   uint32_t res32) {
  uint64_t res = res32;
  for (std::uint32_t i = 2; i < 10; i++) {
    uint64_t byte = static_cast<uint8_t>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}